

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O2

Record * __thiscall
amrex::ParmParse::getRecord(Record *__return_storage_ptr__,ParmParse *this,string *name,int n)

{
  Table *table;
  PP_entry *pPVar1;
  ostream *poVar2;
  string local_a0;
  ParmParse local_80;
  
  table = this->m_table;
  prefixedName((string *)&local_80,this,name);
  pPVar1 = anon_unknown_12::ppindex(table,n,(string *)&local_80,true);
  std::__cxx11::string::~string((string *)&local_80);
  if (pPVar1 == (PP_entry *)0x0) {
    poVar2 = ErrorStream();
    poVar2 = std::operator<<(poVar2,"ParmParse::getRecord: record ");
    poVar2 = std::operator<<(poVar2,(string *)name);
    poVar2 = std::operator<<(poVar2," not found");
    std::endl<char,std::char_traits<char>>(poVar2);
    Abort_host((char *)0x0);
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    ParmParse(&local_80,&local_a0);
    ParmParse(&__return_storage_ptr__->m_pp,&local_80);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  else {
    ParmParse(&local_80,pPVar1->m_table);
    ParmParse(&__return_storage_ptr__->m_pp,&local_80);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

ParmParse::Record
ParmParse::getRecord (const std::string& name, int n) const
{
    const PP_entry* pe = ppindex(m_table, n, prefixedName(name), true);
    if ( pe == 0 )
    {
        amrex::ErrorStream() << "ParmParse::getRecord: record " << name << " not found" << std::endl;
        amrex::Abort();
        return Record(ParmParse());
    } else {
        return Record(ParmParse(*pe->m_table));
    }
}